

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::uniformuiv_invalid_program
               (NegativeTestContext *ctx)

{
  allocator<char> local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  string local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&data,4,(allocator_type *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_OPERATION is generated if there is no current program object.",&local_41);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glUniform1uiv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2uiv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3uiv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4uiv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void uniformuiv_invalid_program (NegativeTestContext& ctx)
{
	std::vector<GLuint> data(4);

	ctx.beginSection("GL_INVALID_OPERATION is generated if there is no current program object.");
	ctx.glUseProgram(0);
	ctx.glUniform1uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}